

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::PinTypeRef(Lowerer *this,JITTypeHolder type,void *typeRef,Instr *instr,
                   PropertyId propertyId)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  char16 *pcVar2;
  char16 *pcVar3;
  char16 *pcVar4;
  char16_t *pcVar5;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  debugStringBuffer._76_4_ = propertyId;
  Func::PinTypeRef(this->m_func,typeRef);
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01453738,TracePinnedTypesPhase,sourceContextId,functionId);
  if (bVar1) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    pcVar2 = JITTimeFunctionBody::GetDisplayName(this_00);
    pcVar3 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_88);
    pcVar4 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
    pcVar5 = L"weak";
    if ((Type)typeRef == type.t) {
      pcVar5 = L"strong";
    }
    Output::Print(L"PinnedTypes: function %s(%s) instr %s property ID %u pinned %s reference 0x%p to type 0x%p.\n"
                  ,pcVar2,pcVar3,pcVar4,(ulong)(uint)debugStringBuffer._76_4_,pcVar5,typeRef,type.t)
    ;
    Output::Flush();
  }
  return;
}

Assistant:

void
Lowerer::PinTypeRef(JITTypeHolder type, void* typeRef, IR::Instr* instr, Js::PropertyId propertyId)
{
    this->m_func->PinTypeRef(typeRef);

    if (PHASE_TRACE(Js::TracePinnedTypesPhase, this->m_func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("PinnedTypes: function %s(%s) instr %s property ID %u pinned %s reference 0x%p to type 0x%p.\n"),
            this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
            Js::OpCodeUtil::GetOpCodeName(instr->m_opcode), propertyId,
            typeRef == type.t ? _u("strong") : _u("weak"), typeRef, type.t);
        Output::Flush();
    }
}